

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O0

ON_SectionStyle * __thiscall
ON_Layer::CustomSectionStyle(ON_Layer *this,ON_SectionStyle *sectionStyle)

{
  ON_SectionStyle *local_20;
  ON_SectionStyle *rc;
  ON_SectionStyle *sectionStyle_local;
  ON_Layer *this_local;
  
  local_20 = (ON_SectionStyle *)0x0;
  if (this->m_private != (ON_LayerPrivate *)0x0) {
    local_20 = std::__shared_ptr<ON_SectionStyle,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<ON_SectionStyle,_(__gnu_cxx::_Lock_policy)2> *)
                          this->m_private);
  }
  if ((sectionStyle != (ON_SectionStyle *)0x0) && (local_20 != (ON_SectionStyle *)0x0)) {
    ON_SectionStyle::operator=(sectionStyle,local_20);
  }
  return local_20;
}

Assistant:

const ON_SectionStyle* ON_Layer::CustomSectionStyle(ON_SectionStyle* sectionStyle) const
{
  const ON_SectionStyle* rc = nullptr;
  if (m_private)
    rc = m_private->m_custom_section_style.get();

  if (sectionStyle && rc)
  {
    *sectionStyle = *rc;
  }

  return rc;
}